

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O2

void diy::
     Serialization<std::map<diy::Direction,_int,_std::less<diy::Direction>,_std::allocator<std::pair<const_diy::Direction,_int>_>_>_>
     ::save(BinaryBuffer *bb,Map *m)

{
  _Base_ptr p_Var1;
  size_t s;
  
  s = (m->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  (*bb->_vptr_BinaryBuffer[2])(bb,&s,8);
  for (p_Var1 = (m->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(m->_M_t)._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    Serialization<std::pair<const_diy::Direction,_int>_>::save(bb,(Pair *)(p_Var1 + 1));
  }
  return;
}

Assistant:

static void         save(BinaryBuffer& bb, const Map& m)
    {
      size_t s = m.size();
      diy::save(bb, s);
      for (typename std::map<K,V>::const_iterator it = m.begin(); it != m.end(); ++it)
        diy::save(bb, *it);
    }